

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Core.cpp
# Opt level: O2

bool __thiscall RenX::Core::initialize(Core *this)

{
  undefined1 *translationsFile;
  pointer pcVar1;
  FILE *__stream;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  string *psVar6;
  ulong uVar7;
  sockaddr *__addr;
  pointer pbVar8;
  pointer pbVar9;
  _Head_base<0UL,_RenX::Server_*,_false> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  container_type server_entries;
  string_view serverList;
  
  (**(code **)(*(long *)banDatabase + 0x20))();
  (**(code **)(*(long *)exemptionDatabase + 0x20))();
  (*(code *)**(undefined8 **)tags)();
  translationsFile = &this->field_0x38;
  initTranslations((Config *)translationsFile);
  serverList = (string_view)Jupiter::Config::get(translationsFile,7,"Servers",0,0);
  uVar7 = 0x14;
  uVar5 = Jupiter::Config::get(translationsFile,0xc,"CommandsFile",0x14,"RenXGameCommands.ini");
  Jupiter::Config::read(&this->m_commandsFile,uVar5);
  local_68._M_len = 2;
  local_68._M_str = " \t";
  jessilib::
  word_split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>
            (&server_entries,&serverList,&local_68);
  for (pbVar9 = server_entries.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 != server_entries.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
    pbVar8 = pbVar9;
    std::make_unique<RenX::Server,std::basic_string_view<char,std::char_traits<char>>const&>
              (&local_68);
    iVar3 = Server::connect((Server *)local_68._M_len,(int)pbVar8,__addr,(socklen_t)uVar7);
    __stream = _stderr;
    if ((char)iVar3 == '\0') {
      psVar6 = Server::getHostname_abi_cxx11_((Server *)local_68._M_len);
      pcVar1 = (psVar6->_M_dataplus)._M_p;
      uVar2 = Server::getPort((Server *)local_68._M_len);
      uVar4 = Jupiter::Socket::getLastError();
      uVar7 = (ulong)uVar2;
      fprintf(__stream,"[RenX] ERROR: Failed to connect to %s on port %u. Error code: %d\r\n",pcVar1
              ,uVar7,(ulong)uVar4);
    }
    else {
      local_70._M_head_impl = (Server *)local_68._M_len;
      local_68._M_len = 0;
      std::
      vector<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>,std::allocator<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>>>
      ::emplace_back<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>>
                ((vector<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>,std::allocator<std::unique_ptr<RenX::Server,std::default_delete<RenX::Server>>>>
                  *)&this->m_servers,
                 (unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> *)&local_70);
      if (local_70._M_head_impl != (Server *)0x0) {
        (*((local_70._M_head_impl)->super_Thinker)._vptr_Thinker[2])();
      }
      local_70._M_head_impl = (Server *)0x0;
    }
    if ((Server *)local_68._M_len != (Server *)0x0) {
      (*((Thinker *)local_68._M_len)->_vptr_Thinker[2])();
    }
  }
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&server_entries.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return true;
}

Assistant:

bool RenX::Core::initialize() {
	RenX::banDatabase->initialize();
	RenX::exemptionDatabase->initialize();
	RenX::tags->initialize();
	RenX::initTranslations(this->config);

	std::string_view serverList = this->config.get("Servers"sv);
	m_commandsFile.read(this->config.get("CommandsFile"sv, "RenXGameCommands.ini"sv));

	auto server_entries = jessilib::word_split_view(serverList, WHITESPACE_SV);
	for (const auto& entry : server_entries) {
		auto server = std::make_unique<RenX::Server>(entry);

		if (server->connect() == false) {
			fprintf(stderr, "[RenX] ERROR: Failed to connect to %s on port %u. Error code: %d" ENDL, server->getHostname().c_str(), server->getPort(), Jupiter::Socket::getLastError());
			continue;
		}

		addServer(std::move(server));
	}

	return true;
}